

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

char * __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  PositionType *this_00;
  pointer *ppbVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *this_01;
  size_type __n;
  string *psVar5;
  PointerType pBVar6;
  cmStateDirectory local_3b0;
  undefined1 local_388 [8];
  cmStateSnapshot parentSnapshot;
  char *retVal;
  string local_358;
  cmStringRange local_338;
  string local_328;
  cmStringRange local_308;
  string local_2f8;
  cmStringRange local_2d8;
  string local_2c8;
  cmStringRange local_2a8;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  const_iterator local_228;
  undefined1 local_220 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  cmStateSnapshot local_188;
  string local_170;
  undefined1 local_150 [8];
  cmStateSnapshot snp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  string local_100;
  cmStateDirectory local_e0;
  reference local_b8;
  cmStateSnapshot *ci;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range2;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *children;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  child_dirs;
  undefined1 local_40 [8];
  cmStateSnapshot parent;
  bool chain_local;
  string *prop_local;
  cmStateDirectory *this_local;
  
  parent.Position.Position._7_1_ = chain;
  if ((GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_)
     , iVar4 != 0)) {
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  }
  std::__cxx11::string::clear();
  bVar2 = std::operator==(prop,"PARENT_DIRECTORY");
  if (bVar2) {
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_40,&this->Snapshot_);
    bVar2 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_40);
    if (bVar2) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)
                 &child_dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmStateSnapshot *)local_40);
      GetCurrentSource_abi_cxx11_
                ((cmStateDirectory *)
                 &child_dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
    }
    else {
      this_local = (cmStateDirectory *)0x88e6c0;
    }
  }
  else {
    _Var3 = std::operator==(prop,&kBINARY_DIR_abi_cxx11_);
    if (_Var3) {
      psVar5 = GetCurrentBinary_abi_cxx11_(this);
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)psVar5);
      this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
    }
    else {
      _Var3 = std::operator==(prop,&kSOURCE_DIR_abi_cxx11_);
      if (_Var3) {
        psVar5 = GetCurrentSource_abi_cxx11_(this);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)psVar5);
        this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
      }
      else {
        _Var3 = std::operator==(prop,&kSUBDIRECTORIES_abi_cxx11_);
        if (_Var3) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&children);
          pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&this->DirectoryState);
          this_01 = &pBVar6->Children;
          __n = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::size(this_01);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&children,__n);
          __end2 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(this_01);
          ci = (cmStateSnapshot *)
               std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(this_01);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                             *)&ci), bVar2) {
            local_b8 = __gnu_cxx::
                       __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                       ::operator*(&__end2);
            cmStateSnapshot::GetDirectory(&local_e0,local_b8);
            psVar5 = GetCurrentSource_abi_cxx11_(&local_e0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&children,psVar5);
            __gnu_cxx::
            __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
            ::operator++(&__end2);
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&local_100,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&children,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&children);
        }
        else {
          _Var3 = std::operator==(prop,&kBUILDSYSTEM_TARGETS_abi_cxx11_);
          if (_Var3) {
            pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)
                       &listFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       &pBVar6->NormalTargetNames,";");
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                       (string *)
                       &listFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &listFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
          }
          else {
            bVar2 = std::operator==(prop,"LISTFILE_STACK");
            if (bVar2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&snp.Position.Position);
              local_150 = (undefined1  [8])(this->Snapshot_).State;
              snp.State = (cmState *)(this->Snapshot_).Position.Tree;
              snp.Position.Tree =
                   (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
                   (this->Snapshot_).Position.Position;
              while (bVar2 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_150), bVar2) {
                cmStateSnapshot::GetExecutionListFile_abi_cxx11_
                          (&local_170,(cmStateSnapshot *)local_150);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&snp.Position.Position,&local_170);
                std::__cxx11::string::~string((string *)&local_170);
                cmStateSnapshot::GetCallStackParent(&local_188,(cmStateSnapshot *)local_150);
                local_150 = (undefined1  [8])local_188.State;
                snp.State = (cmState *)local_188.Position.Tree;
                snp.Position.Tree =
                     (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_188.Position.Position;
              }
              this_00 = &snp.Position.Position;
              local_190._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this_00);
              local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)this_00);
              std::
              reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (local_190,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_198);
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&local_1b8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&snp.Position.Position,";");
              std::__cxx11::string::operator=
                        ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                         ,(string *)&local_1b8);
              std::__cxx11::string::~string((string *)&local_1b8);
              this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&snp.Position.Position);
            }
            else {
              bVar2 = std::operator==(prop,"CACHE_VARIABLES");
              if (bVar2) {
                ppbVar1 = &res.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                cmState::GetCacheEntryKeys_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)ppbVar1,(this->Snapshot_).State);
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (&local_1d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)ppbVar1,";");
                std::__cxx11::string::operator=
                          ((string *)
                           &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                           (string *)&local_1d8);
                std::__cxx11::string::~string((string *)&local_1d8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&res.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
              }
              else {
                bVar2 = std::operator==(prop,"VARIABLES");
                if (bVar2) {
                  cmStateSnapshot::ClosureKeys_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&cacheKeys.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->Snapshot_
                            );
                  cmState::GetCacheEntryKeys_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_220,(this->Snapshot_).State);
                  ppbVar1 = &cacheKeys.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_230._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)ppbVar1);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ::__normal_iterator<std::__cxx11::string*>
                            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              *)&local_228,&local_230);
                  local_238._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_220);
                  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_220);
                  local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                              ::
                              insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                          *)ppbVar1,local_228,local_238,
                                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          )local_240);
                  ppbVar1 = &cacheKeys.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_250._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)ppbVar1);
                  local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)ppbVar1);
                  std::
                  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_250,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_258);
                  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (&local_278,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&cacheKeys.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,";");
                  std::__cxx11::string::operator=
                            ((string *)
                             &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                             (string *)&local_278);
                  std::__cxx11::string::~string((string *)&local_278);
                  this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_220);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cacheKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                else {
                  bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
                  if (bVar2) {
                    local_2a8 = GetIncludeDirectoriesEntries_abi_cxx11_(this);
                    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                              (&local_298,&local_2a8,";");
                    std::__cxx11::string::operator=
                              ((string *)
                               &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                               (string *)&local_298);
                    std::__cxx11::string::~string((string *)&local_298);
                    this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                  }
                  else {
                    bVar2 = std::operator==(prop,"COMPILE_OPTIONS");
                    if (bVar2) {
                      local_2d8 = GetCompileOptionsEntries_abi_cxx11_(this);
                      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                (&local_2c8,&local_2d8,";");
                      std::__cxx11::string::operator=
                                ((string *)
                                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                                 (string *)&local_2c8);
                      std::__cxx11::string::~string((string *)&local_2c8);
                      this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                    }
                    else {
                      bVar2 = std::operator==(prop,"COMPILE_DEFINITIONS");
                      if (bVar2) {
                        local_308 = GetCompileDefinitionsEntries_abi_cxx11_(this);
                        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                  (&local_2f8,&local_308,";");
                        std::__cxx11::string::operator=
                                  ((string *)
                                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                                   ,(string *)&local_2f8);
                        std::__cxx11::string::~string((string *)&local_2f8);
                        this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                      }
                      else {
                        bVar2 = std::operator==(prop,"LINK_OPTIONS");
                        if (bVar2) {
                          local_338 = GetLinkOptionsEntries_abi_cxx11_(this);
                          cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                    (&local_328,&local_338,";");
                          std::__cxx11::string::operator=
                                    ((string *)
                                     &GetProperty(std::__cxx11::string_const&,bool)::
                                      output_abi_cxx11_,(string *)&local_328);
                          std::__cxx11::string::~string((string *)&local_328);
                          this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                        }
                        else {
                          bVar2 = std::operator==(prop,"LINK_DIRECTORIES");
                          if (bVar2) {
                            _retVal = GetLinkDirectoriesEntries_abi_cxx11_(this);
                            cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                      (&local_358,
                                       (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        *)&retVal,";");
                            std::__cxx11::string::operator=
                                      ((string *)
                                       &GetProperty(std::__cxx11::string_const&,bool)::
                                        output_abi_cxx11_,(string *)&local_358);
                            std::__cxx11::string::~string((string *)&local_358);
                            this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                          }
                          else {
                            pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::
                                     iterator::operator->(&this->DirectoryState);
                            parentSnapshot.Position.Position =
                                 (PositionType)
                                 cmPropertyMap::GetPropertyValue(&pBVar6->Properties,prop);
                            this_local = (cmStateDirectory *)parentSnapshot.Position.Position;
                            if (((cmStateDirectory *)parentSnapshot.Position.Position ==
                                 (cmStateDirectory *)0x0) &&
                               ((parent.Position.Position._7_1_ & 1) != 0)) {
                              cmStateSnapshot::GetBuildsystemDirectoryParent
                                        ((cmStateSnapshot *)local_388,&this->Snapshot_);
                              bVar2 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_388);
                              if (bVar2) {
                                cmStateSnapshot::GetDirectory
                                          (&local_3b0,(cmStateSnapshot *)local_388);
                                this_local = (cmStateDirectory *)
                                             GetProperty(&local_3b0,prop,
                                                         (bool)(parent.Position.Position._7_1_ & 1))
                                ;
                              }
                              else {
                                this_local = (cmStateDirectory *)
                                             cmState::GetGlobalProperty
                                                       ((this->Snapshot_).State,prop);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* cmStateDirectory::GetProperty(const std::string& prop,
                                          bool chain) const
{
  static std::string output;
  output.clear();
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return parent.GetDirectory().GetCurrentSource().c_str();
    }
    return "";
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return output.c_str();
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return output.c_str();
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    child_dirs.reserve(children.size());
    for (cmStateSnapshot const& ci : children) {
      child_dirs.push_back(ci.GetDirectory().GetCurrentSource());
    }
    output = cmJoin(child_dirs, ";");
    return output.c_str();
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmJoin(this->DirectoryState->NormalTargetNames, ";");
    return output.c_str();
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return output.c_str();
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return output.c_str();
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    std::vector<std::string> cacheKeys =
      this->Snapshot_.State->GetCacheEntryKeys();
    res.insert(res.end(), cacheKeys.begin(), cacheKeys.end());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return output.c_str();
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "LINK_OPTIONS") {
    output = cmJoin(this->GetLinkOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "LINK_DIRECTORIES") {
    output = cmJoin(this->GetLinkDirectoriesEntries(), ";");
    return output.c_str();
  }

  const char* retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}